

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::PipelinePopper::~PipelinePopper(PipelinePopper *this)

{
  Pipeline *pPVar1;
  Pl_MD5 *pPVar2;
  Count *pCVar3;
  Pl_MD5 *pPVar4;
  pointer ppPVar5;
  element_type *peVar6;
  
  if (this->stack_id == 0) {
    return;
  }
  peVar6 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((ulong)((long)(peVar6->pipeline_stack).
                    super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             *(long *)&(peVar6->pipeline_stack).
                       super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                       super__Vector_impl_data) < 9) {
    __assert_fail("qw->m->pipeline_stack.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3be,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  ::qpdf::pl::Count::finish(peVar6->pipeline);
  peVar6 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ppPVar5 = (peVar6->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pPVar1 = ppPVar5[-1];
  if (pPVar1 == (Pipeline *)0x0) {
    pCVar3 = (Count *)0x0;
  }
  else {
    pCVar3 = (Count *)__dynamic_cast(pPVar1,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0);
  }
  if (pCVar3 != peVar6->pipeline) {
    __assert_fail("dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3c0,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  if (peVar6->pipeline->id_ != this->stack_id) {
    __assert_fail("qw->m->pipeline->id() == stack_id",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3c5,"QPDFWriter::PipelinePopper::~PipelinePopper()");
  }
  if (pPVar1 != (Pipeline *)0x0) {
    (*pPVar1->_vptr_Pipeline[1])(pPVar1);
    peVar6 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ppPVar5 = (peVar6->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppPVar5 = ppPVar5 + -1;
  (peVar6->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppPVar5;
  do {
    ppPVar5 = ppPVar5 + -1;
    pPVar2 = (Pl_MD5 *)*ppPVar5;
    if (pPVar2 == (Pl_MD5 *)0x0) {
LAB_001b44d1:
      pPVar4 = (Pl_MD5 *)0x0;
    }
    else {
      pCVar3 = (Count *)__dynamic_cast(pPVar2,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0);
      if (pCVar3 != (Count *)0x0) {
        peVar6->pipeline = pCVar3;
        return;
      }
      pPVar4 = pPVar2;
      if ((pPVar2->super_Pipeline)._vptr_Pipeline != (_func_int **)&PTR__Pl_MD5_002ac5a8)
      goto LAB_001b44d1;
    }
    if (pPVar4 == peVar6->md5_pipeline) {
      peVar6->md5_pipeline = (Pl_MD5 *)0x0;
    }
    (peVar6->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar5;
    if (pPVar2 != (Pl_MD5 *)0x0) {
      (*(pPVar2->super_Pipeline)._vptr_Pipeline[1])(pPVar2);
      peVar6 = (this->qw->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      ppPVar5 = (peVar6->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  } while( true );
}

Assistant:

QPDFWriter::PipelinePopper::~PipelinePopper()
{
    if (!stack_id) {
        return;
    }
    qpdf_assert_debug(qw->m->pipeline_stack.size() >= 2);
    qw->m->pipeline->finish();
    qpdf_assert_debug(dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline);
    // It might be possible for this assertion to fail if writeLinearized exits by exception when
    // deterministic ID, but I don't think so. As of this writing, this is the only case in which
    // two dynamically allocated PipelinePopper objects ever exist at the same time, so the
    // assertion will fail if they get popped out of order from automatic destruction.
    qpdf_assert_debug(qw->m->pipeline->id() == stack_id);
    delete qw->m->pipeline_stack.back();
    qw->m->pipeline_stack.pop_back();
    while (!dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back())) {
        Pipeline* p = qw->m->pipeline_stack.back();
        if (dynamic_cast<Pl_MD5*>(p) == qw->m->md5_pipeline) {
            qw->m->md5_pipeline = nullptr;
        }
        qw->m->pipeline_stack.pop_back();
        delete p;
    }
    qw->m->pipeline = dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back());
}